

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj.c
# Opt level: O0

void objrevert(void *ctx0,mcmon objn)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  long lVar5;
  ushort in_SI;
  undefined8 *in_RDI;
  int indexed;
  int cnt;
  prpdef *pr;
  uchar *p;
  mcmcxdef *mctx;
  mcmon in_stack_ffffffffffffffae;
  mcmcxdef *in_stack_ffffffffffffffb0;
  mcmcxdef *in_stack_ffffffffffffffb8;
  uint local_2c;
  uchar *local_28;
  
  puVar4 = mcmlck(in_stack_ffffffffffffffb8,(mcmon)((ulong)in_stack_ffffffffffffffb0 >> 0x30));
  local_28 = puVar4 + 0xe;
  uVar1 = osrp2(puVar4 + 4);
  local_28 = local_28 + (int)((uVar1 & 0xffff) << 1);
  uVar1 = osrp2(puVar4 + 2);
  uVar2 = osrp2(puVar4 + 0xc);
  oswp2(puVar4 + 8,uVar2 & 0xffff);
  uVar2 = osrp2(puVar4 + 10);
  oswp2(puVar4 + 6,uVar2 & 0xffff);
  local_2c = osrp2(puVar4 + 6);
  for (local_2c = local_2c & 0xffff; local_2c != 0; local_2c = local_2c - 1) {
    local_28[5] = local_28[5] & 0xfd;
    in_stack_ffffffffffffffb0 = (mcmcxdef *)(local_28 + 6);
    iVar3 = osrp2(local_28 + 3);
    local_28 = (uchar *)((long)in_stack_ffffffffffffffb0->mcmcxmtb + (long)iVar3 + -0x30);
  }
  lVar5 = *(long *)(*(long *)*in_RDI +
                   (long)((int)(uint)*(ushort *)
                                      (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] +
                                      (long)(int)(in_SI & 0xff) * 2) >> 8) * 8) +
          (long)(int)(*(ushort *)
                       (in_RDI[(long)((int)(uint)in_SI >> 8) + 6] + (long)(int)(in_SI & 0xff) * 2) &
                     0xff) * 0x20;
  *(ushort *)(lVar5 + 0x14) = *(ushort *)(lVar5 + 0x14) | 1;
  mcmunlck(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffae);
  if ((uVar1 & 2) != 0) {
    objindx((mcmcxdef *)pr,cnt._2_2_);
  }
  return;
}

Assistant:

void objrevert(void *ctx0, mcmon objn)
{
    mcmcxdef *mctx = (mcmcxdef *)ctx0;
    uchar    *p;
    prpdef   *pr;
    int       cnt;
    int       indexed;
    
    p = mcmlck(mctx, objn);
    pr = objprp(p);
    indexed = objflg(p) & OBJFINDEX;
    
    /* restore original settings */
    objsfree(p, objrst(p));
    objsnp(p, objstat(p));

    /* go through original properties and remove 'ignore' flag if set */
    for (cnt = objnprop(p) ; cnt ; pr = objpnxt(pr), --cnt)
        prpflg(pr) &= ~PRPFIGN;
    
    /* touch object and unlock it */
    mcmtch(mctx, objn);
    mcmunlck(mctx, objn);
    
    /* if it's indexed, rebuild the index */
    if (indexed) objindx(mctx, objn);
}